

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::SetDOMWrapperTracingCallback
          (Recycler *this,void *state,DOMWrapperTracingCallback tracingCallback,
          DOMWrapperTracingDoneCallback tracingDoneCallback,
          DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  undefined4 *puVar1;
  RecyclerCollectionWrapper *pRVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  if (state == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232e,"(state)","state");
    if (!bVar4) goto LAB_00276972;
    *puVar1 = 0;
  }
  if (tracingCallback == (DOMWrapperTracingCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232f,"(tracingCallback)","tracingCallback");
    if (!bVar4) goto LAB_00276972;
    *puVar1 = 0;
  }
  if (enterFinalPauseCallback == (DOMWrapperTracingEnterFinalPauseCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2330,"(enterFinalPauseCallback)","enterFinalPauseCallback");
    if (!bVar4) {
LAB_00276972:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  pRVar2 = this->collectionWrapper;
  pRVar2->wrapperTracingCallbackState = state;
  pRVar2->wrapperTracingCallback = tracingCallback;
  pRVar2->wrapperTracingDoneCallback = tracingDoneCallback;
  pRVar2->wrapperTracingEnterFinalPauseCallback = enterFinalPauseCallback;
  return;
}

Assistant:

void Recycler::SetDOMWrapperTracingCallback(void * state, DOMWrapperTracingCallback tracingCallback, DOMWrapperTracingDoneCallback tracingDoneCallback, DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    Assert(state);
    Assert(tracingCallback);
    Assert(enterFinalPauseCallback);
    this->collectionWrapper->SetWrapperTracingCallbackState(state);
    this->collectionWrapper->SetDOMWrapperTracingCallback(tracingCallback);
    this->collectionWrapper->SetDOMWrapperTracingDoneCallback(tracingDoneCallback);
    this->collectionWrapper->SetDOMWrapperTracingEnterFinalPauseCallback(enterFinalPauseCallback);
}